

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

vector<char,_std::allocator<char>_> * __thiscall
cmELFInternalImpl<cmELFTypes64>::EncodeDynamicEntries
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,
          cmELFInternalImpl<cmELFTypes64> *this,DynamicEntryList *entries)

{
  pointer ppVar1;
  long lVar2;
  unsigned_long uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  undefined1 uVar8;
  pair<long,_unsigned_long> *entry;
  pointer ppVar9;
  ELF_Dyn dyn;
  undefined8 local_40;
  undefined8 local_38;
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             (long)(entries->
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(entries->
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
  ppVar9 = (entries->
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (entries->
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar9 != ppVar1) {
    do {
      lVar2 = ppVar9->first;
      uVar3 = ppVar9->second;
      local_40 = lVar2;
      local_38 = uVar3;
      if ((this->super_cmELFInternal).NeedSwap == true) {
        local_40._0_1_ = (undefined1)lVar2;
        uVar8 = (undefined1)local_40;
        local_40._7_1_ = (undefined1)((ulong)lVar2 >> 0x38);
        local_40._1_2_ = (ushort)((ulong)lVar2 >> 8);
        uVar4 = local_40._1_2_ << 8;
        uVar6 = local_40._1_2_ >> 8;
        local_40._5_2_ = (ushort)((ulong)lVar2 >> 0x28);
        local_40._3_2_ = (ushort)((ulong)lVar2 >> 0x18);
        uVar5 = local_40._3_2_ << 8;
        uVar7 = local_40._3_2_ >> 8;
        local_40 = CONCAT35(CONCAT12(uVar8,uVar4 | uVar6),
                            CONCAT23(uVar5 | uVar7,
                                     CONCAT21(local_40._5_2_ << 8 | local_40._5_2_ >> 8,
                                              local_40._7_1_)));
        local_38._0_2_ = (ushort)uVar3;
        uVar4 = (ushort)local_38 << 8;
        uVar6 = (ushort)local_38 >> 8;
        local_38._6_2_ = (ushort)(uVar3 >> 0x30);
        local_38._2_1_ = (undefined1)(uVar3 >> 0x10);
        uVar8 = local_38._2_1_;
        local_38._5_1_ = (undefined1)(uVar3 >> 0x28);
        local_38._3_2_ = (ushort)(uVar3 >> 0x18);
        uVar5 = local_38._3_2_ << 8;
        uVar7 = local_38._3_2_ >> 8;
        local_38 = CONCAT35(CONCAT21(uVar4 | uVar6,uVar8),
                            CONCAT23(uVar5 | uVar7,
                                     CONCAT12(local_38._5_1_,
                                              local_38._6_2_ << 8 | local_38._6_2_ >> 8)));
      }
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,&local_40,&stack0xffffffffffffffd0);
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != ppVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> cmELFInternalImpl<Types>::EncodeDynamicEntries(
  const cmELF::DynamicEntryList& entries)
{
  std::vector<char> result;
  result.reserve(sizeof(ELF_Dyn) * entries.size());

  for (auto const& entry : entries) {
    // Store the entry in an ELF_Dyn, byteswap it, then serialize to chars
    ELF_Dyn dyn;
    dyn.d_tag = static_cast<tagtype>(entry.first);
    dyn.d_un.d_val = static_cast<tagtype>(entry.second);

    if (this->NeedSwap) {
      this->ByteSwap(dyn);
    }

    char* pdyn = reinterpret_cast<char*>(&dyn);
    cm::append(result, pdyn, pdyn + sizeof(ELF_Dyn));
  }

  return result;
}